

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O0

void __thiscall wasm::SignExtLowering::visitUnary(SignExtLowering *this,Unary *curr)

{
  Unary *curr_local;
  SignExtLowering *this_local;
  
  switch(curr->op) {
  case ExtendS8Int32:
    lowerToShifts<int>(this,curr->value,ShlInt32,ShrSInt32,8);
    break;
  case ExtendS16Int32:
    lowerToShifts<int>(this,curr->value,ShlInt32,ShrSInt32,0x10);
    break;
  case ExtendS8Int64:
    lowerToShifts<long>(this,curr->value,ShlInt64,ShrSInt64,8);
    break;
  case ExtendS16Int64:
    lowerToShifts<long>(this,curr->value,ShlInt64,ShrSInt64,0x10);
    break;
  case ExtendS32Int64:
    lowerToShifts<long>(this,curr->value,ShlInt64,ShrSInt64,0x20);
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    switch (curr->op) {
      case ExtendS8Int32:
        lowerToShifts(curr->value, ShlInt32, ShrSInt32, int32_t(8));
        break;
      case ExtendS16Int32:
        lowerToShifts(curr->value, ShlInt32, ShrSInt32, int32_t(16));
        break;
      case ExtendS8Int64:
        lowerToShifts(curr->value, ShlInt64, ShrSInt64, int64_t(8));
        break;
      case ExtendS16Int64:
        lowerToShifts(curr->value, ShlInt64, ShrSInt64, int64_t(16));
        break;
      case ExtendS32Int64:
        lowerToShifts(curr->value, ShlInt64, ShrSInt64, int64_t(32));
        break;
      default: {
      }
    }
  }